

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O3

int64_t getPSDuration(char *fileName)

{
  byte bVar1;
  bool bVar2;
  void *pvVar3;
  ulong uVar4;
  byte *pbVar5;
  int64_t iVar6;
  size_t __nbytes;
  byte *pbVar7;
  long lVar8;
  int bufferSize;
  int64_t fileSize;
  File file;
  int64_t local_60;
  File local_58;
  
  __nbytes = 0;
  File::File(&local_58,fileName,1,0);
  bVar2 = File::size(&local_58,&local_60);
  if (bVar2) {
    pvVar3 = operator_new__(0x40000);
    uVar4 = File::read(&local_58,(int)pvVar3,(void *)0x40000,__nbytes);
    if (0 < (int)(uint)uVar4) {
      if ((uint)uVar4 < 3) {
LAB_001c6e43:
        uVar4 = 0;
      }
      else {
        pbVar7 = (byte *)((uVar4 & 0xffffffff) + (long)pvVar3);
        pbVar5 = (byte *)((long)pvVar3 + 2);
        uVar4 = 0;
        do {
          lVar8 = 3;
          if (*pbVar5 < 2) {
            if (*pbVar5 == 0) {
              lVar8 = 1;
            }
            else if ((pbVar5[-2] == 0) && (pbVar5[-1] == 0)) {
              pbVar5 = pbVar5 + -2;
              if (pbVar5 <= pbVar7 + -9) goto LAB_001c6eb2;
              goto LAB_001c6e43;
            }
          }
          pbVar5 = pbVar5 + lVar8;
        } while (pbVar5 < pbVar7);
      }
LAB_001c6e46:
      operator_delete__(pvVar3);
      bufferSize = 0x40000;
      bVar1 = 1;
      do {
        iVar6 = getLastPCR(&local_58,bufferSize,local_60);
        bufferSize = 0x100000;
        bVar2 = (bool)(bVar1 & iVar6 == -1);
        bVar1 = 0;
      } while (bVar2);
      File::close(&local_58,0x100000);
      lVar8 = 0;
      if (-1 < iVar6) {
        lVar8 = iVar6 - uVar4;
      }
      goto LAB_001c6e9a;
    }
    operator_delete__(pvVar3);
  }
  lVar8 = 0;
LAB_001c6e9a:
  File::~File(&local_58);
  return lVar8;
LAB_001c6eb2:
  if ((0x30 < (byte)(pbVar5[3] + 0x41) && (pbVar5[3] & 0xbf) != 0xbd) || (-1 < (char)pbVar5[7])) {
    pbVar5 = pbVar5 + 6;
    do {
      lVar8 = 3;
      if (*pbVar5 < 2) {
        if (*pbVar5 == 0) {
          lVar8 = 1;
        }
        else if ((pbVar5[-2] == 0) && (pbVar5[-1] == 0)) goto LAB_001c6f18;
      }
      pbVar5 = pbVar5 + lVar8;
      uVar4 = 0;
      if (pbVar7 <= pbVar5) goto LAB_001c6e46;
    } while( true );
  }
  uVar4 = (ulong)((ushort)(*(ushort *)(pbVar5 + 0xc) << 8 | *(ushort *)(pbVar5 + 0xc) >> 8) >> 1) |
          (ulong)((pbVar5[0xb] & 0xfe) << 0xe | (uint)pbVar5[10] << 0x16) |
          (ulong)(pbVar5[9] >> 1 & 7) << 0x1e;
  goto LAB_001c6e46;
LAB_001c6f18:
  pbVar5 = pbVar5 + -2;
  uVar4 = 0;
  if (pbVar7 + -9 < pbVar5) goto LAB_001c6e46;
  goto LAB_001c6eb2;
}

Assistant:

int64_t getPSDuration(const char* fileName)
{
    constexpr int BUF_SIZE = 1024 * 256;

    try
    {
        int64_t fileSize;
        File file(fileName, File::ofRead);
        if (!file.size(&fileSize))
            return 0;

        const auto tmpBuffer = new uint8_t[BUF_SIZE];

        // pcr from start of file
        const int len = file.read(tmpBuffer, BUF_SIZE);
        if (len < 1)
        {
            delete[] tmpBuffer;
            return 0;
        }
        uint8_t* curPtr = tmpBuffer;
        int64_t firstPcrVal = 0;
        uint8_t* bufEnd = tmpBuffer + len;
        curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
        while (curPtr <= bufEnd - 9)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
            const uint8_t startcode = curPtr[3];
            if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) ||
                (startcode == PES_VC1_ID) || (startcode == PES_PRIVATE_DATA2))
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    firstPcrVal = pesPacket->getPts();
                    break;
                }
            }
            curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
        }
        delete[] tmpBuffer;

        // pcr from end of file

        int64_t lastPcrVal;
        int bufferSize = BUF_SIZE;
        do
        {
            lastPcrVal = getLastPCR(file, bufferSize, fileSize);
            bufferSize *= 4;
        } while (lastPcrVal == -1 && bufferSize <= 1024 * 1024);

        file.close();

        return lastPcrVal >= 0 ? lastPcrVal - firstPcrVal : 0;
    }
    catch (...)
    {
        return 0;
    }
}